

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseExtGNU_ChooseExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  ostream *poVar3;
  ParseOptions *this_01;
  LanguageExtensions *this_02;
  ExtGNU_ChooseExpressionSyntax *pEVar4;
  IndexType IVar5;
  bool local_79;
  ExtGNU_ChooseExpressionSyntax *chooseExpr;
  allocator<char> local_41;
  string local_40;
  ExpressionSyntax **local_20;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  local_20 = expr;
  expr_local = (ExpressionSyntax **)this;
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  if (SVar2 == Keyword_ExtGNU___builtin_choose_expr) {
    this_01 = SyntaxTree::parseOptions(this->tree_);
    this_02 = ParseOptions::languageExtensions(this_01);
    bVar1 = LanguageExtensions::isEnabled_extGNU_InternalBuiltins(this_02);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"GNU internal builtins",&local_41);
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    pEVar4 = makeNode<psy::C::ExtGNU_ChooseExpressionSyntax>(this);
    *local_20 = &pEVar4->super_ExpressionSyntax;
    IVar5 = consume(this);
    pEVar4->kwTkIdx_ = IVar5;
    bVar1 = match(this,OpenParenToken,&pEVar4->openParenTkIdx_);
    local_79 = false;
    if (bVar1) {
      bVar1 = parseConstant<psy::C::ConstantExpressionSyntax>
                        (this,&pEVar4->constExpr_,IntegerConstantExpression);
      local_79 = false;
      if (bVar1) {
        bVar1 = match(this,CommaToken,&pEVar4->commaTkIdx1_);
        local_79 = false;
        if (bVar1) {
          bVar1 = parseExpressionWithPrecedenceAssignment(this,&pEVar4->expr1_);
          local_79 = false;
          if (bVar1) {
            bVar1 = match(this,CommaToken,&pEVar4->commaTkIdx2_);
            local_79 = false;
            if (bVar1) {
              bVar1 = parseExpressionWithPrecedenceAssignment(this,&pEVar4->expr2_);
              local_79 = false;
              if (bVar1) {
                local_79 = match(this,CloseParenToken,&pEVar4->closeParenTkIdx_);
              }
            }
          }
        }
      }
    }
    this_local._7_1_ = local_79;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x30b);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: `__builtin_choose_expr\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseExtGNU_ChooseExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___builtin_choose_expr,
                  return false,
                  "assert failure: `__builtin_choose_expr'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_InternalBuiltins())
        diagReporter_.ExpectedFeature("GNU internal builtins");

    auto chooseExpr = makeNode<ExtGNU_ChooseExpressionSyntax>();
    expr = chooseExpr;
    chooseExpr->kwTkIdx_ = consume();
    return match(SyntaxKind::OpenParenToken, &chooseExpr->openParenTkIdx_)
        && parseConstant<ConstantExpressionSyntax>(chooseExpr->constExpr_, SyntaxKind::IntegerConstantExpression)
        && match(SyntaxKind::CommaToken, &chooseExpr->commaTkIdx1_)
        && parseExpressionWithPrecedenceAssignment(chooseExpr->expr1_)
        && match(SyntaxKind::CommaToken, &chooseExpr->commaTkIdx2_)
        && parseExpressionWithPrecedenceAssignment(chooseExpr->expr2_)
        && match(SyntaxKind::CloseParenToken, &chooseExpr->closeParenTkIdx_);
}